

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

tjhandle tjInitDecompress(void)

{
  void *__s;
  char *__s_00;
  tjinstance *this;
  tjinstance *in_stack_ffffffffffffffe8;
  tjhandle local_8;
  
  __s = malloc(0x6d8);
  if (__s == (void *)0x0) {
    __s_00 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(__s_00,200,"tjInitDecompress(): Memory allocation failure");
    local_8 = (tjhandle)0x0;
  }
  else {
    memset(__s,0,0x6d8);
    snprintf((char *)((long)__s + 0x608),200,"No error");
    local_8 = _tjInitDecompress(in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

static tjhandle _tjInitDecompress(tjinstance *this)
{
  static unsigned char buffer[1];

  /* This is also straight out of example.txt */
  this->dinfo.err = jpeg_std_error(&this->jerr.pub);
  this->jerr.pub.error_exit = my_error_exit;
  this->jerr.pub.output_message = my_output_message;
  this->jerr.emit_message = this->jerr.pub.emit_message;
  this->jerr.pub.emit_message = my_emit_message;
  this->jerr.pub.addon_message_table = turbojpeg_message_table;
  this->jerr.pub.first_addon_message = JMSG_FIRSTADDONCODE;
  this->jerr.pub.last_addon_message = JMSG_LASTADDONCODE;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    free(this);
    return NULL;
  }

  jpeg_create_decompress(&this->dinfo);
  /* Make an initial call so it will create the source manager */
  jpeg_mem_src_tj(&this->dinfo, buffer, 1);

  this->init |= DECOMPRESS;
  return (tjhandle)this;
}